

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

u8 read_u8_pair(Emulator *e,MemoryTypeAddressPair pair,Bool raw)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  PPUMode PVar5;
  JoypadSelect JVar6;
  u8 uVar7;
  byte bVar8;
  Bool BVar9;
  byte bVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  ColorPalettes *pCVar15;
  
  uVar14 = (ulong)pair >> 0x20;
  uVar12 = pair.addr;
  if (MEMORY_MAP_HIGH_RAM < pair.type) {
    fprintf(_stderr,"invalid address: %u 0x%04x.\n",(ulong)pair & 0xffffffff,uVar14 & 0xffff);
    exit(1);
  }
  bVar10 = 0xff;
  uVar11 = uVar14 & 0xffff;
  uVar13 = pair._4_4_;
  switch((ulong)pair & 0xffffffff) {
  default:
    uVar14 = (ulong)(uVar13 & 0xffff |
                    (e->state).memory_map_state.rom_base[(ulong)pair & 0xffffffff]);
    if (e->cart_info->size <= uVar14) {
      __assert_fail("rom_addr < e->cart_info->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x7a0,"u8 read_u8_pair(Emulator *, MemoryTypeAddressPair, Bool)");
    }
    bVar10 = e->cart_info->data[uVar14];
    break;
  case 2:
    ppu_synchronize(e);
    PVar5 = (e->state).ppu.stat.mode;
    if ((PVar5 != PPU_MODE_MODE3) &&
       ((PVar5 != PPU_MODE_MODE2 || ((e->state).ppu.state_ticks != 4)))) {
      if (0x1fff < uVar12) {
        __assert_fail("addr <= ADDR_MASK_8K",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0x684,"u8 read_vram(Emulator *, MaskedAddress)");
      }
      bVar10 = (e->state).vram.data[(ulong)(e->state).vram.offset + (ulong)(uVar13 & 0x1fff)];
    }
    break;
  case 3:
    uVar7 = (*(e->memory_map).read_ext_ram)(e,uVar12);
    return uVar7;
  case 4:
    bVar10 = (e->state).wram.data[uVar14 & 0xffff];
    break;
  case 5:
    bVar10 = (e->state).wram.data[(uVar14 & 0xffff) + (ulong)(e->state).wram.offset];
    break;
  case 6:
    ppu_synchronize(e);
    if (((e->state).ppu.stat.mode2.trigger == FALSE) &&
       (((e->state).ppu.stat.mode & ~PPU_MODE_VBLANK) != PPU_MODE_MODE2)) {
      uVar14 = (ulong)pair >> 0x22 & 0xff;
      switch(uVar13 & 3) {
      case 0:
        bVar10 = (e->state).oam[uVar14].y + 0x10;
        break;
      case 1:
        bVar10 = (e->state).oam[uVar14].x + 8;
        break;
      case 2:
        bVar10 = (e->state).oam[uVar14].tile;
        break;
      case 3:
        bVar10 = (e->state).oam[uVar14].byte3;
      }
    }
    break;
  case 7:
    break;
  case 8:
    switch((int)uVar11) {
    case 0x40:
      uVar1 = (e->state).ppu.lcdc.display;
      uVar2 = (e->state).ppu.lcdc.window_tile_map_select;
      uVar3 = (e->state).ppu.lcdc.window_display;
      uVar4 = (e->state).ppu.lcdc.bg_tile_data_select;
      bVar8 = ((char)uVar4 * '\x10' & 0x10U | (char)uVar2 * '@' & 0x40U |
              (char)uVar3 * ' ' & 0x20U | (char)uVar1 * -0x80) +
              ((byte)(e->state).ppu.lcdc.bg_tile_map_select & 1) * '\b';
      bVar10 = ((byte)(e->state).ppu.lcdc.obj_display & 1) * '\x02' +
               ((byte)(e->state).ppu.lcdc.obj_size & 1) * '\x04' |
               (byte)(e->state).ppu.lcdc.bg_display & 1;
      goto LAB_0010befa;
    case 0x41:
      ppu_synchronize(e);
      bVar10 = (byte)(e->state).ppu.stat.mode & 3 |
               ((byte)(((e->state).ppu.stat.vblank.irq & TRUE) << 4) |
               (byte)(((e->state).ppu.stat.mode2.irq & TRUE) << 5) |
               (byte)(((e->state).ppu.stat.y_compare.irq & TRUE) << 6)) +
               ((byte)(e->state).ppu.stat.hblank.irq & 1) * '\b' +
               ((byte)(e->state).ppu.stat.ly_eq_lyc & 1) * '\x04' | 0x80;
      break;
    case 0x42:
      bVar10 = (e->state).ppu.scy;
      break;
    case 0x43:
      bVar10 = (e->state).ppu.scx;
      break;
    case 0x44:
      ppu_synchronize(e);
      bVar10 = (e->state).ppu.ly;
      break;
    case 0x45:
      bVar10 = (e->state).ppu.lyc;
      break;
    case 0x46:
    case 0x4c:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
      break;
    case 0x47:
    case 0x48:
    case 0x49:
      uVar14 = (ulong)((uVar13 & 0xffff) << 4);
      bVar8 = ((byte)((*(uint *)((e->state).sgb.attr_map + uVar14 + 0x22) & 3) << 4) |
              (byte)(*(int *)((e->state).sgb.attr_map + uVar14 + 0x26) << 6)) +
              ((byte)*(undefined4 *)((e->state).sgb.attr_map + uVar14 + 0x1e) & 3) * '\x04';
      bVar10 = (byte)*(undefined4 *)((e->state).sgb.attr_map + uVar14 + 0x1a) & 3;
LAB_0010befa:
      bVar10 = bVar10 | bVar8;
      break;
    case 0x4a:
      bVar10 = (e->state).ppu.wy;
      break;
    case 0x4b:
      bVar10 = (e->state).ppu.wx;
      break;
    case 0x4d:
      if ((e->state).is_cgb == FALSE) {
        return 0xff;
      }
      BVar9 = (e->state).cpu_speed.speed;
      bVar10 = (byte)(e->state).cpu_speed.switching;
LAB_0010bf66:
      bVar10 = bVar10 & 1 | (byte)(BVar9 << 7) | 0x7e;
      break;
    case 0x4f:
      if ((e->state).is_cgb != FALSE) {
        bVar10 = (e->state).vram.bank | 0xfe;
      }
      break;
    case 0x55:
      if ((e->state).is_cgb != FALSE) {
        bVar10 = (e->state).hdma.blocks;
      }
      break;
    case 0x56:
      if ((e->state).is_cgb != FALSE) {
        bVar10 = (byte)(e->state).infrared.write & 1 |
                 (char)((e->state).infrared.enabled << 6) +
                 ((byte)(e->state).infrared.read & 1) * '\x02' | 0x3c;
      }
      break;
    case 0x68:
    case 0x6a:
      if ((e->state).is_cgb != FALSE) {
        pCVar15 = &(e->state).ppu.bgcp;
        if (uVar12 != 0x68) {
          pCVar15 = &(e->state).ppu.obcp;
        }
        bVar10 = (char)pCVar15->auto_increment << 7 | pCVar15->index & 0x3f | 0x40;
      }
      break;
    case 0x69:
    case 0x6b:
      if ((e->state).is_cgb != FALSE) {
        pCVar15 = &(e->state).ppu.bgcp;
        if (uVar12 != 0x69) {
          pCVar15 = &(e->state).ppu.obcp;
        }
        bVar10 = pCVar15->data[pCVar15->index];
      }
      break;
    case 0x70:
      if ((e->state).is_cgb == FALSE) {
        return 0xff;
      }
      bVar10 = (e->state).wram.bank;
LAB_0010bfdf:
      bVar10 = bVar10 | 0xf8;
      break;
    default:
      switch(uVar11) {
      case 0:
        call_joyp_callback(e,FALSE);
        JVar6 = (e->state).joyp.joypad_select;
        bVar10 = read_joyp_p10_p13(e);
        bVar10 = (char)JVar6 << 4 | bVar10 & 0xf | 0xc0;
        break;
      case 1:
        serial_synchronize(e);
        bVar10 = (e->state).serial.sb;
        break;
      case 2:
        serial_synchronize(e);
        bVar10 = (byte)(e->state).serial.clock;
        BVar9 = (e->state).serial.transferring;
        goto LAB_0010bf66;
      case 3:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        break;
      case 4:
        timer_synchronize(e);
        bVar10 = *(byte *)((long)&(e->state).timer.div_counter + 1);
        break;
      case 5:
        timer_synchronize(e);
        bVar10 = (e->state).timer.tima;
        break;
      case 6:
        timer_synchronize(e);
        bVar10 = (e->state).timer.tma;
        break;
      case 7:
        bVar10 = ((byte)(e->state).timer.clock_select & 3) + (char)(e->state).timer.on * '\x04';
        goto LAB_0010bfdf;
      case 0xf:
        intr_synchronize(e);
        bVar10 = (e->state).interrupt.if_ | 0xe0;
        break;
      default:
        if ((int)uVar11 == 0xff) {
          bVar10 = (e->state).interrupt.ie;
        }
      }
    }
    break;
  case 9:
    apu_synchronize(e);
    if (uVar12 < 0x17) {
      uVar7 = (*(code *)(&DAT_0010fbc4 + *(int *)(&DAT_0010fbc4 + uVar11 * 4)))();
      return uVar7;
    }
    break;
  case 10:
    apu_synchronize(e);
    if ((e->state).apu.channel[2].status == FALSE) {
      uVar14 = uVar14 & 0xffff;
    }
    else {
      if (((e->state).is_cgb == FALSE) && ((e->state).ticks != (e->state).apu.wave.sample_time)) {
        return 0xff;
      }
      uVar14 = (ulong)((e->state).apu.wave.position >> 1);
    }
    bVar10 = (e->state).apu.wave.ram[uVar14];
    break;
  case 0xb:
    bVar10 = (e->state).hram[uVar14 & 0xffff];
  }
  return bVar10;
}

Assistant:

static u8 read_u8_pair(Emulator* e, MemoryTypeAddressPair pair, Bool raw) {
  switch (pair.type) {
    /* Take advantage of the fact that MEMORY_MAP_ROM9 is 0, and ROM1 is 1 when
     * indexing into rom_base. */
    case MEMORY_MAP_ROM0:
    case MEMORY_MAP_ROM1: {
      u32 rom_addr = MMAP_STATE.rom_base[pair.type] | pair.addr;
      assert(rom_addr < e->cart_info->size);
      u8 value = e->cart_info->data[rom_addr];
      if (!raw) {
        HOOK(read_rom_ib, rom_addr, value);
      }
      return value;
    }
    case MEMORY_MAP_VRAM:
      return read_vram(e, pair.addr);
    case MEMORY_MAP_EXT_RAM:
      return e->memory_map.read_ext_ram(e, pair.addr);
    case MEMORY_MAP_WORK_RAM0:
      return WRAM.data[pair.addr];
    case MEMORY_MAP_WORK_RAM1:
      return WRAM.data[WRAM.offset + pair.addr];
    case MEMORY_MAP_OAM:
      return read_oam(e, pair.addr);
    case MEMORY_MAP_UNUSED:
      return INVALID_READ_BYTE;
    case MEMORY_MAP_IO: {
      u8 value = read_io(e, pair.addr);
      HOOK(read_io_asb, pair.addr, get_io_reg_string(pair.addr), value);
      return value;
    }
    case MEMORY_MAP_APU:
      return read_apu(e, pair.addr);
    case MEMORY_MAP_WAVE_RAM:
      return read_wave_ram(e, pair.addr);
    case MEMORY_MAP_HIGH_RAM:
      return HRAM[pair.addr];
    default:
      UNREACHABLE("invalid address: %u 0x%04x.\n", pair.type, pair.addr);
  }
}